

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O1

int bmcg_sat_solver_add_and
              (bmcg_sat_solver *s,int iVar,int iVar0,int iVar1,int fCompl0,int fCompl1,int fCompl)

{
  int iVar2;
  int iVar3;
  undefined4 in_register_0000008c;
  uint uVar4;
  uint uVar5;
  int Lits [3];
  uint local_4c;
  uint local_48;
  uint local_44;
  SimpSolver *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000008c,fCompl1);
  if (-1 < iVar) {
    uVar4 = (uint)(fCompl == 0) + iVar * 2;
    local_4c = uVar4;
    if ((-1 < iVar0) && ((uint)fCompl0 < 2)) {
      local_48 = fCompl0 + iVar0 * 2;
      local_40 = (SimpSolver *)s;
      iVar2 = glucose_solver_addclause((SimpSolver *)s,(int *)&local_4c,2);
      iVar3 = 0;
      if (iVar2 != 0) {
        local_4c = uVar4;
        if ((iVar1 < 0) || (uVar5 = (uint)local_38, 1 < uVar5)) goto LAB_005b18d0;
        local_48 = uVar5 + iVar1 * 2;
        iVar2 = glucose_solver_addclause(local_40,(int *)&local_4c,2);
        iVar3 = 0;
        if (iVar2 != 0) {
          if (1 < (uint)fCompl) goto LAB_005b18d0;
          local_4c = iVar * 2 | fCompl;
          local_48 = (iVar0 * 2 | fCompl0) ^ 1;
          local_44 = (iVar1 * 2 | uVar5) ^ 1;
          iVar3 = glucose_solver_addclause(local_40,(int *)&local_4c,3);
        }
      }
      return iVar3;
    }
  }
LAB_005b18d0:
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12e,"int Abc_Var2Lit(int, int)");
}

Assistant:

int bmcg_sat_solver_add_and( bmcg_sat_solver * s, int iVar, int iVar0, int iVar1, int fCompl0, int fCompl1, int fCompl )
{
    int Lits[3];

    Lits[0] = Abc_Var2Lit( iVar, !fCompl );
    Lits[1] = Abc_Var2Lit( iVar0, fCompl0 );
    if ( !bmcg_sat_solver_addclause( s, Lits, 2 ) )
        return 0;

    Lits[0] = Abc_Var2Lit( iVar, !fCompl );
    Lits[1] = Abc_Var2Lit( iVar1, fCompl1 );
    if ( !bmcg_sat_solver_addclause( s, Lits, 2 ) )
        return 0;

    Lits[0] = Abc_Var2Lit( iVar,   fCompl );
    Lits[1] = Abc_Var2Lit( iVar0, !fCompl0 );
    Lits[2] = Abc_Var2Lit( iVar1, !fCompl1 );
    if ( !bmcg_sat_solver_addclause( s, Lits, 3 ) )
        return 0;

    return 1;
}